

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O3

Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
llbuild::commands::util::readFileContents(StringRef filename)

{
  Child LHS;
  Child LHS_00;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  StringError *this;
  size_t sVar5;
  NodeKind NVar6;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  this_00;
  Child CVar8;
  Child CVar9;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EVar10;
  StringRef str;
  error_code EC;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  SmallString<256U> path;
  Child local_298 [2];
  undefined2 local_288;
  undefined6 uStack_286;
  Child local_278 [2];
  undefined2 local_268;
  undefined6 uStack_266;
  Child local_258 [2];
  undefined2 local_248;
  undefined6 uStack_246;
  Twine local_238;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_218;
  byte local_208;
  undefined4 local_200;
  undefined4 uStack_1fc;
  NodeKind local_1f0;
  char cStack_1ef;
  undefined6 uStack_1ee;
  uint local_1e8;
  undefined4 uStack_1e4;
  NodeKind local_1d8;
  char cStack_1d7;
  undefined6 uStack_1d6;
  uint local_1d0;
  undefined4 uStack_1cc;
  NodeKind local_1c0;
  char cStack_1bf;
  undefined6 uStack_1be;
  uint local_1b8;
  undefined4 uStack_1b4;
  NodeKind local_1a8;
  char cStack_1a7;
  undefined6 uStack_1a6;
  uint local_1a0;
  undefined4 uStack_19c;
  NodeKind local_190;
  char cStack_18f;
  undefined6 uStack_18e;
  Child local_188 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  Error local_168;
  string local_160;
  SmallVectorImpl<char> local_140;
  util local_130 [256];
  
  this_00 = (anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
             )filename.Data;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_140,(char *)filename.Length,(char *)filename.Length + in_RDX);
  llvm::sys::fs::make_absolute(&local_140);
  llvm::Twine::Twine((Twine *)local_188,&local_140);
  sVar5 = 1;
  llvm::MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_218.TStorage,(Twine *)local_188,-1,true,false);
  uVar7 = local_218.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  if ((local_208 & 1) == 0) {
    *(byte *)((long)this_00 + 8) = *(byte *)((long)this_00 + 8) & 0xfe;
    *(AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
      *)this_00 = local_218.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
    local_218.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
    uVar7 = extraout_RDX;
  }
  else {
    llvm::Twine::Twine((Twine *)&local_1a0,"unable to read input \"");
    str.Data = (char *)(local_140.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                       0xffffffff);
    str.Length = sVar5;
    escapedString_abi_cxx11_
              ((string *)local_188,
               (util *)local_140.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,str)
    ;
    llvm::Twine::Twine((Twine *)&local_1b8,(string *)local_188);
    if ((local_190 == NullKind) || (local_1a8 == NullKind)) {
      local_288 = 0x100;
    }
    else if (local_190 == EmptyKind) {
      local_288._1_1_ = cStack_1a7;
      local_288._0_1_ = local_1a8;
      uStack_286 = uStack_1a6;
      local_298[0]._0_4_ = local_1b8;
      local_298[0]._4_4_ = uStack_1b4;
    }
    else if (local_1a8 == EmptyKind) {
      local_288._1_1_ = cStack_18f;
      local_288._0_1_ = local_190;
      uStack_286 = uStack_18e;
      local_298[0]._0_4_ = local_1a0;
      local_298[0]._4_4_ = uStack_19c;
    }
    else {
      CVar9._4_4_ = uStack_19c;
      CVar9.decUI = local_1a0;
      if (cStack_18f != '\x01') {
        local_190 = TwineKind;
        CVar9.twine = (Twine *)&local_1a0;
      }
      if (cStack_1a7 != '\x01') {
        local_1a8 = TwineKind;
      }
      CVar4._4_4_ = uStack_1b4;
      CVar4.decUI = local_1b8;
      CVar8.twine = (Twine *)&local_1b8;
      if (cStack_1a7 == '\x01') {
        CVar8 = CVar4;
      }
      llvm::Twine::Twine((Twine *)local_298,CVar9,local_190,CVar8,local_1a8);
    }
    llvm::Twine::Twine((Twine *)&local_1d0,"\" (");
    if (((NodeKind)local_288 == NullKind) || (local_1c0 == NullKind)) {
      local_268 = 0x100;
    }
    else if ((NodeKind)local_288 == EmptyKind) {
      local_268._1_1_ = cStack_1bf;
      local_268._0_1_ = local_1c0;
      uStack_266 = uStack_1be;
      local_278[0]._0_4_ = local_1d0;
      local_278[0]._4_4_ = uStack_1cc;
    }
    else if (local_1c0 == EmptyKind) {
      local_268._0_1_ = (NodeKind)local_288;
      local_268._1_1_ = local_288._1_1_;
      uStack_266 = uStack_286;
      local_278[0].decUI = local_298[0].decUI;
      local_278[0]._4_4_ = local_298[0]._4_4_;
    }
    else {
      CVar8._4_4_ = local_298[0]._4_4_;
      CVar8.decUI = local_298[0].decUI;
      NVar6 = (NodeKind)local_288;
      if (local_288._1_1_ != EmptyKind) {
        CVar8.twine = (Twine *)local_298;
        NVar6 = TwineKind;
      }
      if (cStack_1bf != '\x01') {
        local_1c0 = TwineKind;
      }
      CVar3._4_4_ = uStack_1cc;
      CVar3.decUI = local_1d0;
      CVar9.twine = (Twine *)&local_1d0;
      if (cStack_1bf == '\x01') {
        CVar9 = CVar3;
      }
      llvm::Twine::Twine((Twine *)local_278,CVar8,NVar6,CVar9,local_1c0);
    }
    (**(code **)(*(long *)local_218._8_8_ + 0x20))(&local_160,local_218._8_8_,uVar7 & 0xffffffff);
    llvm::Twine::Twine((Twine *)&local_1e8,&local_160);
    if (((NodeKind)local_268 == NullKind) || (local_1d8 == NullKind)) {
      local_248 = 0x100;
    }
    else if ((NodeKind)local_268 == EmptyKind) {
      local_248._1_1_ = cStack_1d7;
      local_248._0_1_ = local_1d8;
      uStack_246 = uStack_1d6;
      local_258[0]._0_4_ = local_1e8;
      local_258[0]._4_4_ = uStack_1e4;
    }
    else if (local_1d8 == EmptyKind) {
      local_248._0_1_ = (NodeKind)local_268;
      local_248._1_1_ = local_268._1_1_;
      uStack_246 = uStack_266;
      local_258[0].decUI = local_278[0].decUI;
      local_258[0]._4_4_ = local_278[0]._4_4_;
    }
    else {
      LHS._4_4_ = local_278[0]._4_4_;
      LHS.decUI = local_278[0].decUI;
      NVar6 = (NodeKind)local_268;
      if (local_268._1_1_ != EmptyKind) {
        LHS.twine = (Twine *)local_278;
        NVar6 = TwineKind;
      }
      if (cStack_1d7 != '\x01') {
        local_1d8 = TwineKind;
      }
      CVar2._4_4_ = uStack_1e4;
      CVar2.decUI = local_1e8;
      CVar9.twine = (Twine *)&local_1e8;
      if (cStack_1d7 == '\x01') {
        CVar9 = CVar2;
      }
      llvm::Twine::Twine((Twine *)local_258,LHS,NVar6,CVar9,local_1d8);
    }
    llvm::Twine::Twine((Twine *)&local_200,")");
    if (((NodeKind)local_248 == NullKind) || (local_1f0 == NullKind)) {
      local_238._16_2_ = 0x100;
    }
    else if ((NodeKind)local_248 == EmptyKind) {
      local_238.RHSKind = cStack_1ef;
      local_238.LHSKind = local_1f0;
      local_238._18_6_ = uStack_1ee;
    }
    else if (local_1f0 == EmptyKind) {
      local_238.LHSKind = (NodeKind)local_248;
      local_238.RHSKind = local_248._1_1_;
      local_238._18_6_ = uStack_246;
    }
    else {
      LHS_00._4_4_ = local_258[0]._4_4_;
      LHS_00.decUI = local_258[0].decUI;
      NVar6 = (NodeKind)local_248;
      if (local_248._1_1_ != EmptyKind) {
        LHS_00.twine = (Twine *)local_258;
        NVar6 = TwineKind;
      }
      if (cStack_1ef != '\x01') {
        local_1f0 = TwineKind;
      }
      CVar1._4_4_ = uStack_1fc;
      CVar1.decUI = local_200;
      CVar9.twine = (Twine *)&local_200;
      if (cStack_1ef == '\x01') {
        CVar9 = CVar1;
      }
      llvm::Twine::Twine(&local_238,LHS_00,NVar6,CVar9,local_1f0);
    }
    this = (StringError *)operator_new(0x38);
    EC._0_8_ = uVar7 & 0xffffffff;
    EC._M_cat = (error_category *)local_218._8_8_;
    llvm::StringError::StringError(this,&local_238,EC);
    local_168.Payload = (ErrorInfoBase *)((ulong)this | 1);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)this_00,&local_168);
    uVar7 = extraout_RDX_00;
    if ((long *)((ulong)local_168.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_168.Payload & 0xfffffffffffffffe) + 8))();
      uVar7 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      uVar7 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188[0].twine != &local_178) {
      operator_delete(local_188[0].twine,local_178._M_allocated_capacity + 1);
      uVar7 = extraout_RDX_03;
    }
  }
  if (((local_208 & 1) == 0) &&
     (local_218.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer != (AlignedCharArray<8UL,_8UL>)0x0)
     ) {
    (**(code **)(*(long *)local_218.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
    uVar7 = extraout_RDX_04;
  }
  if ((util *)local_140.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130)
  {
    free(local_140.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    uVar7 = extraout_RDX_05;
  }
  EVar10._8_8_ = uVar7;
  EVar10.field_0 = this_00;
  return EVar10;
}

Assistant:

llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>> util::readFileContents(
    StringRef filename) {
  SmallString<256> path(filename);
  llvm::sys::fs::make_absolute(path);

  auto bufferOrError = llvm::MemoryBuffer::getFile(path);
  if (!bufferOrError) {
    auto ec = bufferOrError.getError();
    return llvm::make_error<llvm::StringError>(
        Twine("unable to read input \"") + util::escapedString(path) +
        "\" (" + ec.message() + ")", ec);
  }
  return std::move(*bufferOrError);
}